

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O3

aiNode * __thiscall Assimp::D3MF::XmlSerializer::ReadObject(XmlSerializer *this,aiScene *scene)

{
  pointer *pppaVar1;
  iterator __position;
  _Head_base<0UL,_aiNode_*,_false> _Var2;
  pointer puVar3;
  char *pcVar4;
  bool bVar5;
  int iVar6;
  aiNode *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  aiMesh *paVar8;
  uint *puVar9;
  pointer __p;
  unsigned_long uVar10;
  long lVar11;
  ulong uVar12;
  unique_ptr<aiNode,_std::default_delete<aiNode>_> node;
  vector<unsigned_long,_std::allocator<unsigned_long>_> meshIds;
  aiMesh *mesh;
  string name;
  string type;
  _Head_base<0UL,_aiNode_*,_false> local_b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  unsigned_long local_88;
  aiMesh *local_80;
  undefined1 *local_78;
  char *local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  vector<aiMesh*,std::allocator<aiMesh*>> *local_58;
  undefined1 *local_50;
  char *local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  char *pcVar7;
  
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78 = &local_68;
  local_70 = (char *)0x0;
  local_68 = 0;
  local_50 = &local_40;
  local_48 = (char *)0x0;
  local_40 = 0;
  local_b0._M_head_impl = this_00;
  iVar6 = (*this->xmlReader->_vptr_IIrrXMLReader[7])();
  pcVar4 = local_70;
  pcVar7 = (char *)CONCAT44(extraout_var,iVar6);
  if (pcVar7 != (char *)0x0) {
    strlen(pcVar7);
    std::__cxx11::string::_M_replace((ulong)&local_78,0,pcVar4,(ulong)pcVar7);
  }
  iVar6 = (*this->xmlReader->_vptr_IIrrXMLReader[7])();
  pcVar4 = local_48;
  pcVar7 = (char *)CONCAT44(extraout_var_00,iVar6);
  if (pcVar7 != (char *)0x0) {
    strlen(pcVar7);
    std::__cxx11::string::_M_replace((ulong)&local_50,0,pcVar4,(ulong)pcVar7);
  }
  pcVar4 = local_70;
  _Var2._M_head_impl = local_b0._M_head_impl;
  (local_b0._M_head_impl)->mParent = scene->mRootNode;
  if (local_70 < (char *)0x400) {
    ((local_b0._M_head_impl)->mName).length = (ai_uint32)local_70;
    memcpy(((local_b0._M_head_impl)->mName).data,local_78,(size_t)local_70);
    ((_Var2._M_head_impl)->mName).data[(long)pcVar4] = '\0';
  }
  local_58 = (vector<aiMesh*,std::allocator<aiMesh*>> *)&this->mMeshes;
  uVar10 = (long)(this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  while( true ) {
    bVar5 = ReadToEndElement(this,(string *)&XmlTag::object_abi_cxx11_);
    puVar3 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    _Var2._M_head_impl = local_b0._M_head_impl;
    if (!bVar5) break;
    (*this->xmlReader->_vptr_IIrrXMLReader[0xd])();
    iVar6 = std::__cxx11::string::compare(XmlTag::mesh_abi_cxx11_);
    if (iVar6 == 0) {
      paVar8 = ReadMesh(this);
      pcVar4 = local_70;
      local_80 = paVar8;
      if (local_70 < (char *)0x400) {
        (paVar8->mName).length = (ai_uint32)local_70;
        memcpy((paVar8->mName).data,local_78,(size_t)local_70);
        (paVar8->mName).data[(long)pcVar4] = '\0';
      }
      __position._M_current =
           (this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                  (local_58,__position,&local_80);
      }
      else {
        *__position._M_current = local_80;
        pppaVar1 = &(this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppaVar1 = *pppaVar1 + 1;
      }
      local_88 = uVar10;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (&local_a8,&local_88);
      uVar10 = uVar10 + 1;
    }
  }
  lVar11 = (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  (local_b0._M_head_impl)->mNumMeshes = (uint)lVar11;
  puVar9 = (uint *)operator_new__((ulong)((long)local_a8.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_a8.
                                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 1 &
                                  0x3fffffffc);
  (_Var2._M_head_impl)->mMeshes = puVar9;
  if (0 < lVar11) {
    uVar12 = lVar11 + 1;
    lVar11 = 0;
    do {
      *(undefined4 *)((long)puVar9 + lVar11) = *(undefined4 *)((long)puVar3 + lVar11 * 2);
      uVar12 = uVar12 - 1;
      lVar11 = lVar11 + 4;
    } while (1 < uVar12);
  }
  local_b0._M_head_impl = (aiNode *)0x0;
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::~unique_ptr
            ((unique_ptr<aiNode,_std::default_delete<aiNode>_> *)&local_b0);
  return _Var2._M_head_impl;
}

Assistant:

aiNode* ReadObject(aiScene* scene) {
        std::unique_ptr<aiNode> node(new aiNode());

        std::vector<unsigned long> meshIds;

        const char *attrib( nullptr );
        std::string name, type;
        attrib = xmlReader->getAttributeValue( D3MF::XmlTag::id.c_str() );
        if ( nullptr != attrib ) {
            name = attrib;
        }
        attrib = xmlReader->getAttributeValue( D3MF::XmlTag::type.c_str() );
        if ( nullptr != attrib ) {
            type = attrib;
        }

        node->mParent = scene->mRootNode;
        node->mName.Set(name);

        size_t meshIdx = mMeshes.size();

        while(ReadToEndElement(D3MF::XmlTag::object)) {
            if(xmlReader->getNodeName() == D3MF::XmlTag::mesh) {
                auto mesh = ReadMesh();

                mesh->mName.Set(name);
                mMeshes.push_back(mesh);
                meshIds.push_back(static_cast<unsigned long>(meshIdx));
                ++meshIdx;
            }
        }

        node->mNumMeshes = static_cast<unsigned int>(meshIds.size());

        node->mMeshes = new unsigned int[node->mNumMeshes];

        std::copy(meshIds.begin(), meshIds.end(), node->mMeshes);

        return node.release();
    }